

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::InsertionSort<Memory::WriteBarrierPtr<void>>
               (WriteBarrierPtr<void> *list,uint32 length,CompareVarsInfo *cvInfo)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  WriteBarrierPtr<void> *this;
  ulong uVar6;
  WriteBarrierPtr<void> *local_40;
  WriteBarrierPtr<void> local_38;
  WriteBarrierPtr<void> item;
  
  p_Var1 = cvInfo->compareType;
  local_38.ptr = (void *)0x0;
  local_40 = list + 1;
  for (uVar3 = 1; uVar3 < length; uVar3 = uVar3 + 1) {
    Memory::WriteBarrierPtr<void>::operator=(&local_38,list + uVar3);
    uVar4 = (int)uVar3 - 1;
    uVar5 = 0;
    uVar6 = uVar3;
    while( true ) {
      bVar2 = (*p_Var1)(cvInfo,&local_38,list + uVar4);
      if (bVar2) {
        uVar6 = (ulong)uVar4;
      }
      else {
        uVar5 = uVar4 + 1;
        uVar4 = (uint)uVar6;
      }
      if (uVar4 < uVar5 || uVar4 - uVar5 == 0) break;
      uVar4 = (uVar4 - uVar5 >> 1) + uVar5;
    }
    this = local_40;
    uVar6 = uVar3;
    while (uVar5 < uVar6) {
      uVar6 = uVar6 - 1;
      Memory::WriteBarrierPtr<void>::operator=(this,list + (uVar6 & 0xffffffff));
      this = this + -1;
    }
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(list + uVar5,local_38.ptr);
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }